

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
tinyusdz::tydra::GetGeomSubsets
          (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
           *__return_storage_ptr__,Stage *stage,Path *prim_path,token *familyName,
          bool prim_must_be_geommesh)

{
  vtable_type *pvVar1;
  Prim *pPVar2;
  bool bVar3;
  __type _Var4;
  uint32_t uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Prim *p;
  Prim *this;
  GeomSubset *pv;
  Prim *pprim;
  GeomSubset *local_68;
  Prim *local_60;
  optional<tinyusdz::Token> local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = (Prim *)0x0;
  bVar3 = Stage::find_prim_at_path(stage,prim_path,&local_60,(string *)0x0);
  if (((bVar3) && (local_60 != (Prim *)0x0)) &&
     ((!prim_must_be_geommesh ||
      ((pvVar1 = (local_60->_data).v_.vtable, pvVar1 != (vtable_type *)0x0 &&
       (uVar5 = (*pvVar1->type_id)(), uVar5 == 0x405)))))) {
    pPVar2 = (local_60->_children).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (local_60->_children).
                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                super__Vector_impl_data._M_start; this != pPVar2; this = this + 1) {
      local_68 = Prim::as<tinyusdz::GeomSubset>(this);
      if (local_68 != (GeomSubset *)0x0) {
        if (((familyName->str_)._M_string_length == 0) ||
           (bVar3 = TypedAttribute<tinyusdz::Token>::authored(&local_68->familyName), !bVar3)) {
LAB_00279844:
          ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ::push_back(__return_storage_ptr__,&local_68);
        }
        else {
          nonstd::optional_lite::optional<tinyusdz::Token>::optional
                    (&local_58,&(local_68->familyName)._attrib);
          bVar3 = local_58.has_value_;
          nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_58);
          if (bVar3 == true) {
            nonstd::optional_lite::optional<tinyusdz::Token>::optional
                      (&local_58,&(local_68->familyName)._attrib);
            __rhs = &nonstd::optional_lite::optional<tinyusdz::Token>::value(&local_58)->str_;
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_58);
            _Var4 = ::std::operator==(&familyName->str_,__rhs);
            if (_Var4) goto LAB_00279844;
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const GeomSubset *> GetGeomSubsets(
    const tinyusdz::Stage &stage, const tinyusdz::Path &prim_path,
    const tinyusdz::value::token &familyName, bool prim_must_be_geommesh) {
  std::vector<const GeomSubset *> result;

  const Prim *pprim{nullptr};
  if (!stage.find_prim_at_path(prim_path, pprim)) {
    return result;
  }

  if (!pprim) {
    return result;
  }

  if (prim_must_be_geommesh && !pprim->is<GeomMesh>()) {
    return result;
  }

  // Only account for child Prims.
  for (const auto &p : pprim->children()) {
    if (auto pv = p.as<GeomSubset>()) {
      if (familyName.valid()) {
        if (pv->familyName.authored()) {
          if (pv->familyName.get_value().has_value()) {
            const value::token &tok = pv->familyName.get_value().value();
            if (familyName.str() == tok.str()) {
              result.push_back(pv);
            }
          } else {
            // connection attr or value block?
            // skip adding this GeomSubset.
          }
        } else {
          result.push_back(pv);
        }
      } else {
        result.push_back(pv);
      }
    }
  }

  return result;
}